

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall icu_63::FormatParser::set(FormatParser *this,UnicodeString *pattern)

{
  int iVar1;
  ulong uVar2;
  int32_t len;
  int32_t local_74;
  UnicodeString local_70;
  
  local_74 = 0;
  this->itemNumber = 0;
  uVar2 = 0;
  do {
    iVar1 = (*this->_vptr_FormatParser[2])(this,pattern,uVar2,&local_74);
    if (iVar1 != 1) {
      return;
    }
    icu_63::UnicodeString::UnicodeString(&local_70,pattern,(int)uVar2,local_74);
    iVar1 = this->itemNumber;
    this->itemNumber = iVar1 + 1;
    icu_63::UnicodeString::moveFrom
              ((UnicodeString *)(&this->field_0x8 + (long)iVar1 * 0x40),&local_70);
    icu_63::UnicodeString::~UnicodeString(&local_70);
    uVar2 = (ulong)(uint)((int)uVar2 + local_74);
  } while (this->itemNumber < 0x32);
  return;
}

Assistant:

void
FormatParser::set(const UnicodeString& pattern) {
    int32_t startPos = 0;
    TokenStatus result = START;
    int32_t len = 0;
    itemNumber = 0;

    do {
        result = setTokens( pattern, startPos, &len );
        if ( result == ADD_TOKEN )
        {
            items[itemNumber++] = UnicodeString(pattern, startPos, len );
            startPos += len;
        }
        else {
            break;
        }
    } while (result==ADD_TOKEN && itemNumber < MAX_DT_TOKEN);
}